

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O1

void QAnimationTimer::unregisterAnimation(QAbstractAnimation *animation)

{
  long lVar1;
  QObject *obj;
  QObjectData *pQVar2;
  long lVar3;
  long lVar4;
  QAbstractAnimation *in_RDI;
  int iVar5;
  long unaff_R14;
  long in_FS_OFFSET;
  QAbstractAnimation *local_40;
  void *local_38;
  char *pcStack_30;
  QMetaTypeInterface *local_28 [2];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = in_RDI;
  lVar4 = __tls_get_addr(&PTR_006ba338);
  if (*(char *)(lVar4 + 0x80) == '\0') {
    unregisterAnimation();
  }
  obj = *(QObject **)(lVar4 + 0x78);
  if (obj != (QObject *)0x0) {
    unregisterRunningAnimation((QAnimationTimer *)obj,local_40);
    if (*(char *)((long)&(local_40->super_QObject).d_ptr.d[1].bindingStorage.d + 1) != '\x01')
    goto LAB_003adb00;
    pQVar2 = obj[3].d_ptr.d;
    if (pQVar2 == (QObjectData *)0x0) {
LAB_003ada6c:
      iVar5 = -1;
    }
    else {
      lVar4 = -8;
      do {
        iVar5 = (int)unaff_R14;
        lVar1 = (long)pQVar2 * -8 + lVar4;
        if (lVar1 == -8) goto LAB_003ada66;
        unaff_R14 = lVar4 + 8;
        lVar3 = lVar4 + 8;
        lVar4 = unaff_R14;
      } while (*(QAbstractAnimation **)((long)obj[3]._vptr_QObject + lVar3) != local_40);
      iVar5 = (int)(unaff_R14 >> 3);
LAB_003ada66:
      if (lVar1 == -8) goto LAB_003ada6c;
    }
    if (iVar5 == -1) {
      QtPrivate::sequential_erase_one<QList<QAbstractAnimation*>,QAbstractAnimation*>
                ((QList<QAbstractAnimation_*> *)(obj + 4),&local_40);
    }
    else {
      QList<QAbstractAnimation_*>::removeAt
                ((QList<QAbstractAnimation_*> *)&obj[2].d_ptr,(long)iVar5);
      if (iVar5 <= *(int *)&obj[2]._vptr_QObject) {
        *(int *)&obj[2]._vptr_QObject = *(int *)&obj[2]._vptr_QObject + -1;
      }
      if ((obj[3].d_ptr.d == (QObjectData *)0x0) &&
         (*(char *)((long)&obj[2]._vptr_QObject + 6) == '\0')) {
        *(undefined1 *)((long)&obj[2]._vptr_QObject + 6) = 1;
        local_38 = (void *)0x0;
        pcStack_30 = (char *)0x0;
        local_28[0] = (QMetaTypeInterface *)0x0;
        QMetaObject::invokeMethodImpl
                  (obj,"stopTimer",QueuedConnection,1,&local_38,&pcStack_30,local_28);
      }
    }
  }
  *(undefined1 *)((long)&(local_40->super_QObject).d_ptr.d[1].bindingStorage.d + 1) = 0;
LAB_003adb00:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAnimationTimer::unregisterAnimation(QAbstractAnimation *animation)
{
    QAnimationTimer *inst = QAnimationTimer::instance(false);
    if (inst) {
        //at this point the unified timer should have been created
        //but it might also have been already destroyed in case the application is shutting down

        inst->unregisterRunningAnimation(animation);

        if (!QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer)
            return;

        int idx = inst->animations.indexOf(animation);
        if (idx != -1) {
            inst->animations.removeAt(idx);
            // this is needed if we unregister an animation while its running
            if (idx <= inst->currentAnimationIdx)
                --inst->currentAnimationIdx;

            if (inst->animations.isEmpty() && !inst->stopTimerPending) {
                inst->stopTimerPending = true;
                QMetaObject::invokeMethod(inst, "stopTimer", Qt::QueuedConnection);
            }
        } else {
            inst->animationsToStart.removeOne(animation);
        }
    }
    QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer = false;
}